

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  LZ4_stream_t_internal *__src;
  long lVar1;
  char cVar2;
  BYTE *s;
  LZ4_byte *pLVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  char *pcVar7;
  long *plVar8;
  long *plVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong *puVar16;
  int *piVar17;
  long *plVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  BYTE *e_4;
  char *pcVar22;
  int iVar23;
  BYTE *e_2;
  ulong *puVar24;
  long lVar25;
  char *pcVar26;
  ulong *puVar27;
  uint uVar28;
  uint uVar29;
  long *plVar30;
  ulong *puVar31;
  long *plVar32;
  char cVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  int *piVar38;
  long lVar39;
  ulong uVar40;
  ulong *puVar41;
  long lVar42;
  BYTE *d;
  BYTE *e;
  ulong uVar43;
  ulong uVar44;
  char *pcVar45;
  LZ4_byte *pLVar46;
  int iVar47;
  BYTE *e_1;
  int *piVar48;
  bool bVar49;
  U32 *hashTable;
  U32 *hashTable_22;
  ulong *local_f0;
  ulong *local_e8;
  long *local_d8;
  ulong *local_d0;
  ulong *local_c8;
  ulong *local_c0;
  int *local_b8;
  int *local_b0;
  long *local_a8;
  ulong *local_a0;
  int *local_88;
  
  if ((ulong)(LZ4_stream->internal_donotuse).dictSize == 0) {
    pLVar46 = (LZ4_byte *)0x0;
  }
  else {
    pLVar46 = (LZ4_stream->internal_donotuse).dictionary + (LZ4_stream->internal_donotuse).dictSize;
  }
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  iVar21 = 1;
  if (1 < acceleration) {
    iVar21 = acceleration;
  }
  if (0x10000 < iVar21) {
    iVar21 = 0x10001;
  }
  if (((((LZ4_stream->internal_donotuse).dictSize < 4) && (0 < inputSize)) &&
      (pLVar46 != (LZ4_byte *)source)) &&
     ((LZ4_stream->internal_donotuse).dictCtx == (LZ4_stream_t_internal *)0x0)) {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
    pLVar46 = (LZ4_byte *)source;
  }
  pLVar3 = (LZ4_byte *)(source + inputSize);
  if (((LZ4_stream->internal_donotuse).dictionary < pLVar3) && (pLVar3 < pLVar46)) {
    uVar10 = (int)pLVar46 - (int)pLVar3;
    uVar20 = 0x10000;
    if (uVar10 < 0x10000) {
      uVar20 = uVar10;
    }
    uVar43 = 0;
    if (3 < uVar10) {
      uVar43 = (ulong)uVar20;
    }
    (LZ4_stream->internal_donotuse).dictSize = (LZ4_u32)uVar43;
    (LZ4_stream->internal_donotuse).dictionary = pLVar46 + -uVar43;
  }
  iVar47 = (int)dest;
  if (pLVar46 == (LZ4_byte *)source) {
    uVar20 = (LZ4_stream->internal_donotuse).dictSize;
    uVar43 = (ulong)uVar20;
    if (uVar43 < 0x10000) {
      uVar10 = (LZ4_stream->internal_donotuse).currentOffset;
      piVar17 = (int *)(ulong)uVar10;
      if (uVar20 < uVar10) {
        if (0x7e000000 < (uint)inputSize) {
          return 0;
        }
        if (inputSize != 0) {
          pcVar26 = dest + maxOutputSize;
          (LZ4_stream->internal_donotuse).dictSize = uVar20 + inputSize;
          (LZ4_stream->internal_donotuse).currentOffset = uVar10 + inputSize;
          (LZ4_stream->internal_donotuse).tableType = 2;
          plVar8 = (long *)source;
          if (0xc < inputSize) {
            lVar42 = (long)source - (long)piVar17;
            *(uint *)((long)LZ4_stream +
                     ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar10;
            plVar30 = (long *)(source + 1);
            uVar44 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
            local_a8 = (long *)dest;
            do {
              uVar29 = 1;
              uVar13 = iVar21 << 6;
              while( true ) {
                plVar32 = (long *)((ulong)uVar29 + (long)plVar30);
                iVar19 = (int)plVar30;
                iVar34 = (int)lVar42;
                if (source + ((ulong)(uint)inputSize - 0xb) < plVar32) {
                  iVar23 = 2;
                }
                else {
                  uVar29 = *(uint *)((long)LZ4_stream + uVar44 * 4);
                  piVar17 = (int *)((ulong)uVar29 + lVar42);
                  uVar4 = (ulong)(*plVar32 * -0x30e4432345000000) >> 0x34;
                  *(int *)((long)LZ4_stream + uVar44 * 4) = iVar19 - iVar34;
                  iVar23 = 8;
                  uVar44 = uVar4;
                  if (((uVar10 - uVar20 <= uVar29) && ((uint)(iVar19 - iVar34) <= uVar29 + 0xffff))
                     && (iVar23 = 7, *piVar17 != (int)*plVar30)) {
                    iVar23 = 0;
                  }
                }
                if ((iVar23 != 0) && (iVar23 != 8)) break;
                uVar29 = uVar13 >> 6;
                uVar13 = uVar13 + 1;
                plVar30 = plVar32;
              }
              if (iVar23 == 7) {
                iVar23 = 0;
              }
              plVar32 = local_a8;
              if (iVar23 == 0) {
                uVar29 = iVar19 - (int)plVar8;
                lVar25 = 0;
                cVar2 = (char)plVar30 * '\x10' + (char)plVar8 * -0x10;
                uVar13 = uVar29 - 0xf;
                do {
                  uVar28 = uVar13;
                  cVar33 = cVar2;
                  lVar35 = lVar25;
                  piVar38 = (int *)((long)piVar17 + lVar35);
                  plVar9 = (long *)((long)plVar30 + lVar35);
                  if ((piVar38 <= source + -uVar43) || (plVar9 <= plVar8)) break;
                  lVar25 = lVar35 + -1;
                  cVar2 = cVar33 + -0x10;
                  uVar13 = uVar28 - 1;
                } while (*(char *)((long)plVar30 + lVar35 + -1) ==
                         *(char *)((long)piVar17 + lVar35 + -1));
                iVar23 = (int)lVar35;
                uVar4 = (ulong)(uint)(iVar23 + (iVar19 - (int)plVar8));
                plVar32 = (long *)((long)local_a8 + 1);
                pcVar22 = (char *)((long)local_a8 +
                                  ((ulong)uVar29 + lVar35 & 0xffffffff) / 0xff + uVar4 + 9);
                if (pcVar26 < pcVar22) {
                  iVar23 = 1;
                }
                else {
                  if ((uint)((ulong)uVar29 + lVar35) < 0xf) {
                    *(char *)local_a8 = cVar33;
                    plVar30 = plVar32;
                  }
                  else {
                    uVar40 = (ulong)(uVar29 - 0xf) + lVar35;
                    *(char *)local_a8 = -0x10;
                    if (0xfe < (int)uVar40) {
                      if (0x1fc < (int)uVar28) {
                        uVar28 = 0x1fd;
                      }
                      uVar13 = (uVar29 - uVar28) + iVar23 + 0xef;
                      uVar40 = (ulong)uVar13 / 0xff;
                      memset(plVar32,0xff,(ulong)(uVar13 / 0xff + 1));
                      plVar32 = (long *)((long)local_a8 + uVar40 + 2);
                      uVar40 = (ulong)((uVar29 - 0x10e) + iVar23 + (int)uVar40 * -0xff);
                    }
                    *(char *)plVar32 = (char)uVar40;
                    plVar30 = (long *)((long)plVar32 + 1);
                  }
                  plVar32 = (long *)(uVar4 + (long)plVar30);
                  plVar18 = plVar8;
                  do {
                    *plVar30 = *plVar18;
                    plVar30 = plVar30 + 1;
                    plVar18 = plVar18 + 1;
                  } while (plVar30 < plVar32);
                  iVar23 = 0;
                }
                plVar30 = plVar9;
                piVar17 = piVar38;
                if (pcVar22 <= pcVar26) {
                  do {
                    uVar4 = 0xcf1bbcdcbb000000;
                    *(short *)plVar32 = (short)plVar9 - (short)piVar38;
                    puVar31 = (ulong *)((long)plVar9 + 4);
                    puVar5 = (ulong *)(piVar38 + 1);
                    puVar14 = puVar31;
                    if (puVar31 < source + ((ulong)(uint)inputSize - 0xc)) {
                      uVar40 = *(ulong *)((long)plVar9 + 4) ^ *(ulong *)(piVar38 + 1);
                      uVar4 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                        }
                      }
                      uVar4 = uVar4 >> 3 & 0x1fffffff;
                      uVar13 = (uint)uVar4;
                      puVar14 = (ulong *)((long)plVar9 + 0xc);
                      puVar5 = (ulong *)(piVar38 + 3);
                      if (*(ulong *)(piVar38 + 1) == *(ulong *)((long)plVar9 + 4))
                      goto LAB_0035ffc8;
                    }
                    else {
LAB_0035ffc8:
                      do {
                        if (source + ((ulong)(uint)inputSize - 0xc) <= puVar14) {
                          if ((puVar14 < source + ((ulong)(uint)inputSize - 8)) &&
                             ((int)*puVar5 == (int)*puVar14)) {
                            puVar14 = (ulong *)((long)puVar14 + 4);
                            puVar5 = (ulong *)((long)puVar5 + 4);
                          }
                          if ((puVar14 < source + ((ulong)(uint)inputSize - 6)) &&
                             ((short)*puVar5 == (short)*puVar14)) {
                            puVar14 = (ulong *)((long)puVar14 + 2);
                            puVar5 = (ulong *)((long)puVar5 + 2);
                          }
                          if (puVar14 < source + ((ulong)(uint)inputSize - 5)) {
                            puVar14 = (ulong *)((long)puVar14 +
                                               (ulong)((char)*puVar5 == (char)*puVar14));
                          }
                          uVar13 = (int)puVar14 - (int)puVar31;
                          break;
                        }
                        uVar40 = *puVar5;
                        uVar37 = *puVar14 ^ uVar40;
                        uVar36 = 0;
                        if (uVar37 != 0) {
                          for (; (uVar37 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                          }
                        }
                        puVar27 = (ulong *)((uVar36 >> 3 & 0x1fffffff) + (long)puVar14);
                        puVar5 = puVar5 + 1;
                        bVar49 = uVar40 == *puVar14;
                        puVar14 = puVar14 + 1;
                        if (!bVar49) {
                          puVar14 = puVar27;
                        }
                        uVar4 = uVar4 & 0xffffffff;
                        if (!bVar49) {
                          uVar4 = (ulong)(uint)((int)puVar27 - (int)puVar31);
                        }
                        uVar13 = (uint)uVar4;
                      } while (bVar49);
                    }
                    plVar18 = (long *)((long)plVar32 + 2);
                    pcVar22 = (char *)((long)plVar32 + (ulong)(uVar13 + 0xf0) / 0xff + 8);
                    if (pcVar22 <= pcVar26) {
                      if (uVar13 < 0xf) {
                        *(char *)local_a8 = (char)*local_a8 + (char)uVar13;
                      }
                      else {
                        *(char *)local_a8 = (char)*local_a8 + '\x0f';
                        uVar29 = uVar13 - 0xf;
                        *(undefined4 *)plVar18 = 0xffffffff;
                        if (0x3fb < uVar29) {
                          uVar28 = uVar13 - 0x40b;
                          memset((char *)((long)plVar32 + 6),0xff,(ulong)((uVar28 / 0x3fc) * 4 + 4))
                          ;
                          uVar29 = uVar28 % 0x3fc;
                          plVar18 = (long *)((long)plVar32 + (ulong)((uVar28 / 0x3fc) * 4) + 6);
                        }
                        pcVar45 = (char *)((long)plVar18 + (ulong)uVar29 / 0xff);
                        plVar18 = (long *)(pcVar45 + 1);
                        *pcVar45 = (char)(uVar29 / 0xff) + (char)uVar29;
                      }
                    }
                    lVar25 = (ulong)uVar13 + (long)plVar9;
                    plVar9 = (long *)(lVar25 + 4);
                    plVar30 = plVar9;
                    piVar17 = piVar38;
                    plVar32 = plVar18;
                    if (pcVar26 < pcVar22) {
                      iVar23 = 1;
                      goto LAB_0036023f;
                    }
                    plVar8 = plVar9;
                    if (source + ((ulong)(uint)inputSize - 0xb) <= plVar9) {
                      iVar23 = 3;
                      goto LAB_0036023f;
                    }
                    *(int *)((long)LZ4_stream +
                            ((ulong)(*(long *)(lVar25 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                         ((int)lVar25 + 2) - iVar34;
                    uVar4 = (ulong)(*plVar9 * -0x30e4432345000000) >> 0x34;
                    uVar29 = (int)plVar9 - iVar34;
                    uVar13 = *(uint *)((long)LZ4_stream + uVar4 * 4);
                    piVar38 = (int *)((ulong)uVar13 + lVar42);
                    *(uint *)((long)LZ4_stream + uVar4 * 4) = uVar29;
                    bVar49 = true;
                    if (((uVar10 - uVar20 <= uVar13) && (uVar29 <= uVar13 + 0xffff)) &&
                       (*piVar38 == *(int *)plVar9)) {
                      *(char *)plVar18 = '\0';
                      bVar49 = false;
                      plVar32 = (long *)((long)plVar18 + 1);
                      local_a8 = plVar18;
                    }
                  } while (!bVar49);
                  uVar44 = (ulong)(*(long *)(lVar25 + 5) * -0x30e4432345000000) >> 0x34;
                  iVar23 = 0;
                  plVar30 = (long *)(lVar25 + 5);
                  piVar17 = piVar38;
                }
              }
LAB_0036023f:
              local_a8 = plVar32;
            } while (iVar23 == 0);
            dest = (char *)local_a8;
            if (1 < iVar23 - 2U) {
              return 0;
            }
          }
          pcVar45 = source + ((ulong)(uint)inputSize - (long)plVar8);
          pcVar22 = (char *)((long)dest + (long)(pcVar45 + (ulong)(pcVar45 + 0xf0) / 0xff + 1));
          if (pcVar22 <= pcVar26) {
            if (pcVar45 < (char *)0xf) {
              *dest = (char)pcVar45 << 4;
            }
            else {
              pcVar7 = pcVar45 + -0xf;
              *dest = -0x10;
              plVar30 = (long *)((long)dest + 1);
              if ((char *)0xfe < pcVar7) {
                uVar43 = (ulong)(pcVar45 + -0x10e) / 0xff;
                memset((long *)((long)dest + 1),0xff,uVar43 + 1);
                pcVar7 = pcVar45 + uVar43 * -0xff + -0x10e;
                plVar30 = (long *)((long)dest + uVar43 + 2);
              }
              dest = (char *)plVar30;
              *dest = (char)pcVar7;
            }
            memcpy((char *)((long)dest + 1),plVar8,(size_t)pcVar45);
            dest = (char *)((long)dest + (long)(pcVar45 + 1));
          }
          if (pcVar22 <= pcVar26) {
            return (int)dest - iVar47;
          }
          return 0;
        }
        goto LAB_0035f3b4;
      }
    }
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    if (inputSize != 0) {
      uVar10 = (LZ4_stream->internal_donotuse).currentOffset;
      pcVar26 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar20 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar10 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      local_d8 = (long *)dest;
      plVar8 = (long *)source;
      if (0xc < inputSize) {
        lVar42 = (long)source - (ulong)uVar10;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar10;
        plVar30 = (long *)(source + 1);
        uVar44 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
        do {
          uVar10 = 1;
          uVar20 = iVar21 << 6;
          while( true ) {
            plVar32 = (long *)((ulong)uVar10 + (long)plVar30);
            iVar19 = (int)plVar30;
            iVar34 = (int)lVar42;
            if (source + ((ulong)(uint)inputSize - 0xb) < plVar32) {
              iVar23 = 2;
            }
            else {
              uVar10 = *(uint *)((long)LZ4_stream + uVar44 * 4);
              local_88 = (int *)((ulong)uVar10 + lVar42);
              uVar4 = (ulong)(*plVar32 * -0x30e4432345000000) >> 0x34;
              *(int *)((long)LZ4_stream + uVar44 * 4) = iVar19 - iVar34;
              iVar23 = 8;
              uVar44 = uVar4;
              if (((uint)(iVar19 - iVar34) <= uVar10 + 0xffff) &&
                 (iVar23 = 7, *local_88 != (int)*plVar30)) {
                iVar23 = 0;
              }
            }
            if ((iVar23 != 0) && (iVar23 != 8)) break;
            uVar10 = uVar20 >> 6;
            uVar20 = uVar20 + 1;
            plVar30 = plVar32;
          }
          if (iVar23 == 7) {
            iVar23 = 0;
          }
          plVar32 = local_d8;
          if (iVar23 == 0) {
            uVar10 = iVar19 - (int)plVar8;
            lVar25 = 0;
            cVar2 = (char)plVar30 * '\x10' + (char)plVar8 * -0x10;
            uVar20 = uVar10 - 0xf;
            do {
              uVar13 = uVar20;
              cVar33 = cVar2;
              lVar35 = lVar25;
              piVar17 = (int *)((long)local_88 + lVar35);
              plVar9 = (long *)((long)plVar30 + lVar35);
              if ((piVar17 <= source + -uVar43) || (plVar9 <= plVar8)) break;
              lVar25 = lVar35 + -1;
              cVar2 = cVar33 + -0x10;
              uVar20 = uVar13 - 1;
            } while (*(char *)((long)plVar30 + lVar35 + -1) ==
                     *(char *)((long)local_88 + lVar35 + -1));
            iVar23 = (int)lVar35;
            plVar18 = (long *)(ulong)(uint)(iVar23 + (iVar19 - (int)plVar8));
            plVar32 = (long *)((long)local_d8 + 1);
            pcVar22 = (char *)((long)local_d8 + (long)plVar18);
            if (pcVar26 < pcVar22 + ((ulong)uVar10 + lVar35 & 0xffffffff) / 0xff + 9) {
              iVar23 = 1;
            }
            else {
              if ((uint)((ulong)uVar10 + lVar35) < 0xf) {
                *(char *)local_d8 = cVar33;
                plVar30 = plVar32;
              }
              else {
                uVar4 = (ulong)(uVar10 - 0xf) + lVar35;
                *(char *)local_d8 = -0x10;
                if (0xfe < (int)uVar4) {
                  if (0x1fc < (int)uVar13) {
                    uVar13 = 0x1fd;
                  }
                  uVar20 = (uVar10 - uVar13) + iVar23 + 0xef;
                  uVar4 = (ulong)uVar20 / 0xff;
                  memset(plVar32,0xff,(ulong)(uVar20 / 0xff + 1));
                  plVar32 = (long *)((long)local_d8 + uVar4 + 2);
                  uVar4 = (ulong)((uVar10 - 0x10e) + iVar23 + (int)uVar4 * -0xff);
                }
                *(char *)plVar32 = (char)uVar4;
                plVar30 = (long *)((long)plVar32 + 1);
              }
              plVar32 = (long *)((long)plVar18 + (long)plVar30);
              plVar18 = plVar8;
              do {
                *plVar30 = *plVar18;
                plVar30 = plVar30 + 1;
                plVar18 = plVar18 + 1;
              } while (plVar30 < plVar32);
              iVar23 = 0;
              plVar18 = plVar32;
            }
            plVar30 = plVar9;
            local_88 = piVar17;
            if (pcVar22 + ((ulong)uVar10 + lVar35 & 0xffffffff) / 0xff + 9 <= pcVar26) {
              do {
                *(short *)plVar32 = (short)plVar9 - (short)piVar17;
                puVar31 = (ulong *)((long)plVar9 + 4);
                puVar5 = (ulong *)(piVar17 + 1);
                puVar14 = puVar31;
                if (puVar31 < source + ((ulong)(uint)inputSize - 0xc)) {
                  uVar40 = *(ulong *)((long)plVar9 + 4) ^ *(ulong *)(piVar17 + 1);
                  uVar4 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                    }
                  }
                  plVar18 = (long *)(uVar4 >> 3 & 0x1fffffff);
                  uVar20 = (uint)plVar18;
                  puVar14 = (ulong *)((long)plVar9 + 0xc);
                  puVar5 = (ulong *)(piVar17 + 3);
                  if (*(ulong *)(piVar17 + 1) == *(ulong *)((long)plVar9 + 4)) goto LAB_0035f6c2;
                }
                else {
LAB_0035f6c2:
                  do {
                    if (source + ((ulong)(uint)inputSize - 0xc) <= puVar14) {
                      if ((puVar14 < source + ((ulong)(uint)inputSize - 8)) &&
                         ((int)*puVar5 == (int)*puVar14)) {
                        puVar14 = (ulong *)((long)puVar14 + 4);
                        puVar5 = (ulong *)((long)puVar5 + 4);
                      }
                      if ((puVar14 < source + ((ulong)(uint)inputSize - 6)) &&
                         ((short)*puVar5 == (short)*puVar14)) {
                        puVar14 = (ulong *)((long)puVar14 + 2);
                        puVar5 = (ulong *)((long)puVar5 + 2);
                      }
                      if (puVar14 < source + ((ulong)(uint)inputSize - 5)) {
                        puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar5 == (char)*puVar14)
                                           );
                      }
                      uVar20 = (int)puVar14 - (int)puVar31;
                      break;
                    }
                    uVar4 = *puVar5;
                    uVar36 = *puVar14 ^ uVar4;
                    uVar40 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    puVar27 = (ulong *)((uVar40 >> 3 & 0x1fffffff) + (long)puVar14);
                    puVar5 = puVar5 + 1;
                    bVar49 = uVar4 == *puVar14;
                    puVar14 = puVar14 + 1;
                    if (!bVar49) {
                      puVar14 = puVar27;
                    }
                    plVar18 = (long *)((ulong)plVar18 & 0xffffffff);
                    if (!bVar49) {
                      plVar18 = (long *)(ulong)(uint)((int)puVar27 - (int)puVar31);
                    }
                    uVar20 = (uint)plVar18;
                  } while (bVar49);
                }
                plVar18 = (long *)((long)plVar32 + 2);
                pcVar22 = (char *)((long)plVar32 + (ulong)(uVar20 + 0xf0) / 0xff + 8);
                if (pcVar22 <= pcVar26) {
                  if (uVar20 < 0xf) {
                    *(char *)local_d8 = (char)*local_d8 + (char)uVar20;
                  }
                  else {
                    *(char *)local_d8 = (char)*local_d8 + '\x0f';
                    uVar10 = uVar20 - 0xf;
                    *(undefined4 *)plVar18 = 0xffffffff;
                    if (0x3fb < uVar10) {
                      uVar13 = uVar20 - 0x40b;
                      memset((char *)((long)plVar32 + 6),0xff,(ulong)((uVar13 / 0x3fc) * 4 + 4));
                      uVar10 = uVar13 % 0x3fc;
                      plVar18 = (long *)((long)plVar32 + (ulong)((uVar13 / 0x3fc) * 4) + 6);
                    }
                    pcVar45 = (char *)((long)plVar18 + (ulong)uVar10 / 0xff);
                    plVar18 = (long *)(pcVar45 + 1);
                    *pcVar45 = (char)(uVar10 / 0xff) + (char)uVar10;
                  }
                }
                lVar25 = (ulong)uVar20 + (long)plVar9;
                plVar9 = (long *)(lVar25 + 4);
                plVar30 = plVar9;
                plVar32 = plVar18;
                local_88 = piVar17;
                if (pcVar26 < pcVar22) {
                  iVar23 = 1;
                  goto LAB_0035f927;
                }
                plVar8 = plVar9;
                if (source + ((ulong)(uint)inputSize - 0xb) <= plVar9) {
                  iVar23 = 3;
                  goto LAB_0035f927;
                }
                *(int *)((long)LZ4_stream +
                        ((ulong)(*(long *)(lVar25 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                     ((int)lVar25 + 2) - iVar34;
                uVar4 = (ulong)(*plVar9 * -0x30e4432345000000) >> 0x34;
                uVar10 = (int)plVar9 - iVar34;
                uVar20 = *(uint *)((long)LZ4_stream + uVar4 * 4);
                piVar17 = (int *)((ulong)uVar20 + lVar42);
                *(uint *)((long)LZ4_stream + uVar4 * 4) = uVar10;
                bVar49 = true;
                if ((uVar10 <= uVar20 + 0xffff) && (*piVar17 == *(int *)plVar9)) {
                  *(char *)plVar18 = '\0';
                  bVar49 = false;
                  local_d8 = plVar18;
                  plVar18 = (long *)((long)plVar18 + 1);
                }
                plVar32 = plVar18;
                plVar18 = (long *)dest;
              } while (!bVar49);
              uVar44 = (ulong)(*(long *)(lVar25 + 5) * -0x30e4432345000000) >> 0x34;
              iVar23 = 0;
              plVar30 = (long *)(lVar25 + 5);
              local_88 = piVar17;
            }
          }
LAB_0035f927:
          local_d8 = plVar32;
        } while (iVar23 == 0);
        if (1 < iVar23 - 2U) {
          return 0;
        }
      }
      pcVar45 = source + ((ulong)(uint)inputSize - (long)plVar8);
      pcVar22 = (char *)((long)local_d8 + (long)(pcVar45 + (ulong)(pcVar45 + 0xf0) / 0xff + 1));
      if (pcVar22 <= pcVar26) {
        if (pcVar45 < (char *)0xf) {
          *(char *)local_d8 = (char)pcVar45 << 4;
        }
        else {
          pcVar7 = pcVar45 + -0xf;
          *(char *)local_d8 = -0x10;
          plVar30 = (long *)((long)local_d8 + 1);
          if ((char *)0xfe < pcVar7) {
            uVar43 = (ulong)(pcVar45 + -0x10e) / 0xff;
            memset(plVar30,0xff,uVar43 + 1);
            plVar30 = (long *)((long)local_d8 + uVar43 + 2);
            pcVar7 = pcVar45 + uVar43 * -0xff + -0x10e;
          }
          *(char *)plVar30 = (char)pcVar7;
          local_d8 = plVar30;
        }
        memcpy((char *)((long)local_d8 + 1),plVar8,(size_t)pcVar45);
        local_d8 = (long *)((long)local_d8 + (long)(pcVar45 + 1));
      }
      if (pcVar22 <= pcVar26) {
        return (int)local_d8 - iVar47;
      }
      return 0;
    }
LAB_0035f3b4:
    if (0 < maxOutputSize) {
      *dest = '\0';
    }
    return (uint)(0 < maxOutputSize);
  }
  __src = (LZ4_stream->internal_donotuse).dictCtx;
  local_c0 = (ulong *)source;
  if (__src == (LZ4_stream_t_internal *)0x0) {
    uVar20 = (LZ4_stream->internal_donotuse).dictSize;
    uVar43 = (ulong)uVar20;
    if (uVar43 < 0x10000) {
      uVar10 = (LZ4_stream->internal_donotuse).currentOffset;
      if (uVar10 <= uVar20) goto LAB_0035e20c;
      if (0x7e000000 < (uint)inputSize) goto LAB_0035e21a;
      if (inputSize == 0) goto LAB_0035f399;
      piVar17 = (int *)(LZ4_stream->internal_donotuse).dictionary;
      lVar25 = uVar43 + (long)piVar17;
      lVar42 = lVar25 - (ulong)uVar10;
      if (piVar17 == (int *)0x0) {
        lVar42 = 0;
      }
      pcVar26 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar20 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar10 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < inputSize) {
        lVar35 = (long)source - (ulong)uVar10;
        puVar31 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        if (piVar17 == (int *)0x0) {
          lVar25 = 0;
        }
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar10;
        puVar14 = (ulong *)(source + 1);
        uVar43 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
        puVar5 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
        iVar19 = 0;
        piVar38 = (int *)source;
        local_d0 = (ulong *)dest;
        local_a0 = (ulong *)source;
        do {
          uVar29 = 1;
          uVar13 = iVar21 << 6;
          while( true ) {
            puVar27 = (ulong *)((ulong)uVar29 + (long)puVar14);
            iVar34 = (int)puVar14;
            iVar23 = (int)lVar35;
            if (source + ((ulong)(uint)inputSize - 0xb) < puVar27) {
              iVar12 = 2;
            }
            else {
              uVar28 = iVar34 - iVar23;
              uVar29 = *(uint *)((long)LZ4_stream + uVar43 * 4);
              lVar1 = lVar35;
              if (uVar29 < uVar10) {
                lVar1 = lVar42;
              }
              local_e8 = (ulong *)(lVar1 + (ulong)uVar29);
              piVar38 = (int *)source;
              if (uVar29 < uVar10) {
                piVar38 = piVar17;
              }
              uVar44 = *puVar27 * -0x30e4432345000000 >> 0x34;
              *(uint *)((long)LZ4_stream + uVar43 * 4) = uVar28;
              iVar12 = 8;
              uVar43 = uVar44;
              if ((uVar10 - uVar20 <= uVar29) && (uVar28 <= uVar29 + 0xffff)) {
                if (*(int *)local_e8 == (int)*puVar14) {
                  iVar19 = uVar28 - uVar29;
                  iVar12 = 7;
                }
                else {
                  iVar12 = 0;
                }
              }
            }
            if ((iVar12 != 0) && (iVar12 != 8)) break;
            uVar29 = uVar13 >> 6;
            uVar13 = uVar13 + 1;
            puVar14 = puVar27;
          }
          if (iVar12 == 7) {
            iVar12 = 0;
          }
          puVar27 = local_d0;
          if (iVar12 == 0) {
            uVar29 = iVar34 - (int)local_a0;
            lVar1 = 0;
            cVar2 = (char)puVar14 * '\x10' + (char)local_a0 * -0x10;
            uVar13 = uVar29 - 0xf;
            do {
              uVar28 = uVar13;
              cVar33 = cVar2;
              lVar39 = lVar1;
              piVar48 = (int *)((long)local_e8 + lVar39);
              puVar24 = (ulong *)((long)puVar14 + lVar39);
              if ((piVar48 <= piVar38) || (puVar24 <= local_a0)) break;
              lVar1 = lVar39 + -1;
              cVar2 = cVar33 + -0x10;
              uVar13 = uVar28 - 1;
            } while (*(char *)((long)puVar14 + lVar39 + -1) ==
                     *(char *)((long)local_e8 + lVar39 + -1));
            iVar12 = (int)lVar39;
            uVar44 = (ulong)(uint)((iVar34 - (int)local_a0) + iVar12);
            puVar27 = (ulong *)((long)local_d0 + 1);
            pcVar22 = (char *)((long)local_d0 +
                              ((ulong)uVar29 + lVar39 & 0xffffffff) / 0xff + uVar44 + 9);
            if (pcVar26 < pcVar22) {
              iVar12 = 1;
            }
            else {
              if ((uint)((ulong)uVar29 + lVar39) < 0xf) {
                *(char *)local_d0 = cVar33;
                puVar14 = puVar27;
              }
              else {
                uVar4 = (ulong)(uVar29 - 0xf) + lVar39;
                *(char *)local_d0 = -0x10;
                if (0xfe < (int)uVar4) {
                  if (0x1fc < (int)uVar28) {
                    uVar28 = 0x1fd;
                  }
                  uVar13 = (uVar29 - uVar28) + iVar12 + 0xef;
                  uVar4 = (ulong)uVar13 / 0xff;
                  memset(puVar27,0xff,(ulong)(uVar13 / 0xff + 1));
                  puVar27 = (ulong *)((long)local_d0 + uVar4 + 2);
                  uVar4 = (ulong)((uVar29 - 0x10e) + iVar12 + (int)uVar4 * -0xff);
                }
                *(char *)puVar27 = (char)uVar4;
                puVar14 = (ulong *)((long)puVar27 + 1);
              }
              puVar27 = (ulong *)(uVar44 + (long)puVar14);
              puVar6 = local_a0;
              do {
                *puVar14 = *puVar6;
                puVar14 = puVar14 + 1;
                puVar6 = puVar6 + 1;
              } while (puVar14 < puVar27);
              iVar12 = 0;
            }
            puVar14 = puVar24;
            local_e8 = (ulong *)piVar48;
            if (pcVar22 <= pcVar26) {
              do {
                *(short *)puVar27 = (short)iVar19;
                if (piVar38 == piVar17) {
                  puVar14 = (ulong *)((lVar25 - (long)piVar48) + (long)puVar24);
                  if (puVar31 < puVar14) {
                    puVar14 = puVar31;
                  }
                  puVar6 = (ulong *)((long)puVar24 + 4);
                  puVar15 = (ulong *)(piVar48 + 1);
                  puVar16 = puVar6;
                  puVar41 = puVar15;
                  if (puVar6 < (ulong *)((long)puVar14 - 7U)) {
                    uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)(piVar48 + 1);
                    uVar44 = 0;
                    if (uVar4 != 0) {
                      for (; (uVar4 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar44 = uVar44 >> 3 & 0x1fffffff;
                    puVar16 = (ulong *)((long)puVar24 + 0xc);
                    puVar41 = (ulong *)(piVar48 + 3);
                    if (*(ulong *)(piVar48 + 1) == *(ulong *)((long)puVar24 + 4)) goto LAB_0035d4e6;
                  }
                  else {
LAB_0035d4e6:
                    do {
                      puVar15 = puVar41;
                      if ((ulong *)((long)puVar14 - 7U) <= puVar16) {
                        if ((puVar16 < (ulong *)((long)puVar14 - 3U)) &&
                           ((int)*puVar15 == (int)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 4);
                          puVar15 = (ulong *)((long)puVar15 + 4);
                        }
                        if ((puVar16 < (ulong *)((long)puVar14 - 1U)) &&
                           ((short)*puVar15 == (short)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 2);
                          puVar15 = (ulong *)((long)puVar15 + 2);
                        }
                        if (puVar16 < puVar14) {
                          uVar44 = *puVar15;
                          puVar15 = (ulong *)CONCAT71((int7)((ulong)puVar15 >> 8),(char)uVar44);
                          puVar16 = (ulong *)((long)puVar16 +
                                             (ulong)((char)uVar44 == (char)*puVar16));
                        }
                        uVar44 = (ulong)(uint)((int)puVar16 - (int)puVar6);
                        goto LAB_0035d526;
                      }
                      uVar44 = *puVar15;
                      uVar4 = *puVar16;
                      uVar36 = uVar4 ^ uVar44;
                      uVar40 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      iVar34 = (int)puVar16;
                      puVar15 = puVar15 + 1;
                      puVar16 = puVar16 + 1;
                      puVar41 = puVar15;
                    } while (uVar44 == uVar4);
                    uVar44 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar34) - (int)puVar6);
                  }
LAB_0035d526:
                  uVar13 = (uint)uVar44;
                  puVar24 = (ulong *)((long)puVar24 + uVar44 + 4);
                  if (puVar24 == puVar14) {
                    puVar16 = puVar14;
                    puVar6 = (ulong *)source;
                    if (puVar14 < puVar5) {
                      uVar44 = *(ulong *)source;
                      uVar4 = *puVar14;
                      uVar40 = 0;
                      if ((uVar4 ^ uVar44) != 0) {
                        for (; ((uVar4 ^ uVar44) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      puVar15 = (ulong *)(uVar40 >> 3 & 0x1fffffff);
                      uVar29 = (uint)puVar15;
                      if (uVar44 == uVar4) {
                        puVar6 = (ulong *)(source + (ulong)(uVar44 == uVar4) * 8);
                        puVar16 = puVar14 + (uVar44 == uVar4);
                        goto LAB_0035d738;
                      }
                    }
                    else {
LAB_0035d738:
                      do {
                        if (puVar5 <= puVar16) {
                          if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) &&
                             ((int)*puVar6 == (int)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 4);
                            puVar6 = (ulong *)((long)puVar6 + 4);
                          }
                          if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
                             ((short)*puVar6 == (short)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 2);
                            puVar6 = (ulong *)((long)puVar6 + 2);
                          }
                          if (puVar16 < puVar31) {
                            puVar16 = (ulong *)((long)puVar16 +
                                               (ulong)((char)*puVar6 == (char)*puVar16));
                          }
                          uVar29 = (int)puVar16 - (int)puVar14;
                          break;
                        }
                        uVar44 = *puVar6;
                        uVar40 = *puVar16 ^ uVar44;
                        uVar4 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                          }
                        }
                        puVar41 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar16);
                        puVar6 = puVar6 + 1;
                        bVar49 = uVar44 == *puVar16;
                        puVar16 = puVar16 + 1;
                        if (!bVar49) {
                          puVar16 = puVar41;
                        }
                        puVar15 = (ulong *)((ulong)puVar15 & 0xffffffff);
                        if (!bVar49) {
                          puVar15 = (ulong *)(ulong)(uint)((int)puVar41 - (int)puVar14);
                        }
                        uVar29 = (uint)puVar15;
                      } while (bVar49);
                    }
                    uVar13 = uVar13 + uVar29;
                    puVar24 = (ulong *)((long)puVar24 + (ulong)uVar29);
                  }
                }
                else {
                  puVar14 = (ulong *)((long)puVar24 + 4);
                  puVar6 = (ulong *)(piVar48 + 1);
                  puVar15 = puVar14;
                  if (puVar14 < puVar5) {
                    uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)(piVar48 + 1);
                    uVar44 = 0;
                    if (uVar4 != 0) {
                      for (; (uVar4 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar44 = uVar44 >> 3 & 0x1fffffff;
                    puVar15 = (ulong *)((long)puVar24 + 0xc);
                    puVar6 = (ulong *)(piVar48 + 3);
                    if (*(ulong *)(piVar48 + 1) == *(ulong *)((long)puVar24 + 4)) goto LAB_0035d43b;
                  }
                  else {
LAB_0035d43b:
                    do {
                      if (puVar5 <= puVar15) {
                        if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                           ((int)*puVar6 == (int)*puVar15)) {
                          puVar15 = (ulong *)((long)puVar15 + 4);
                          puVar6 = (ulong *)((long)puVar6 + 4);
                        }
                        if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                           ((short)*puVar6 == (short)*puVar15)) {
                          puVar15 = (ulong *)((long)puVar15 + 2);
                          puVar6 = (ulong *)((long)puVar6 + 2);
                        }
                        if (puVar15 < puVar31) {
                          puVar15 = (ulong *)((long)puVar15 +
                                             (ulong)((char)*puVar6 == (char)*puVar15));
                        }
                        uVar44 = (ulong)(uint)((int)puVar15 - (int)puVar14);
                        goto LAB_0035d476;
                      }
                      uVar44 = *puVar6;
                      uVar4 = *puVar15;
                      uVar36 = uVar4 ^ uVar44;
                      uVar40 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      iVar34 = (int)puVar15;
                      puVar6 = puVar6 + 1;
                      puVar15 = puVar15 + 1;
                    } while (uVar44 == uVar4);
                    uVar44 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar34) - (int)puVar14);
                  }
LAB_0035d476:
                  uVar13 = (uint)uVar44;
                  puVar24 = (ulong *)((long)puVar24 + uVar44 + 4);
                }
                puVar6 = (ulong *)((long)puVar27 + 2);
                pcVar22 = (char *)((long)puVar27 + (ulong)(uVar13 + 0xf0) / 0xff + 8);
                if (pcVar22 <= pcVar26) {
                  if (uVar13 < 0xf) {
                    *(char *)local_d0 = (char)*local_d0 + (char)uVar13;
                  }
                  else {
                    *(char *)local_d0 = (char)*local_d0 + '\x0f';
                    uVar29 = uVar13 - 0xf;
                    *(undefined4 *)puVar6 = 0xffffffff;
                    if (0x3fb < uVar29) {
                      uVar13 = uVar13 - 0x40b;
                      memset((char *)((long)puVar27 + 6),0xff,(ulong)((uVar13 / 0x3fc) * 4 + 4));
                      uVar29 = uVar13 % 0x3fc;
                      puVar6 = (ulong *)((long)puVar27 + (ulong)((uVar13 / 0x3fc) * 4) + 6);
                    }
                    pcVar45 = (char *)((long)puVar6 + (ulong)uVar29 / 0xff);
                    puVar6 = (ulong *)(pcVar45 + 1);
                    *pcVar45 = (char)((ulong)uVar29 * 0x8080808081 >> 0x27);
                  }
                }
                puVar14 = puVar24;
                puVar27 = puVar6;
                local_e8 = (ulong *)piVar48;
                if (pcVar26 < pcVar22) {
                  iVar12 = 1;
                  goto LAB_0035d8f5;
                }
                local_a0 = puVar24;
                if (source + ((ulong)(uint)inputSize - 0xb) <= puVar24) {
                  iVar12 = 3;
                  goto LAB_0035d8f5;
                }
                *(int *)((long)LZ4_stream +
                        ((ulong)(*(long *)((long)puVar24 + -2) * -0x30e4432345000000) >> 0x34) * 4)
                     = ((int)puVar24 + -2) - iVar23;
                uVar44 = *puVar24 * -0x30e4432345000000 >> 0x34;
                uVar29 = (int)puVar24 - iVar23;
                uVar13 = *(uint *)((long)LZ4_stream + uVar44 * 4);
                lVar1 = lVar35;
                if (uVar13 < uVar10) {
                  lVar1 = lVar42;
                }
                piVar48 = (int *)((ulong)uVar13 + lVar1);
                piVar38 = (int *)source;
                if (uVar13 < uVar10) {
                  piVar38 = piVar17;
                }
                *(uint *)((long)LZ4_stream + uVar44 * 4) = uVar29;
                bVar49 = true;
                if (((uVar10 - uVar20 <= uVar13) && (uVar29 <= uVar13 + 0xffff)) &&
                   (*piVar48 == (int)*puVar24)) {
                  *(char *)puVar6 = '\0';
                  iVar19 = uVar29 - uVar13;
                  bVar49 = false;
                  puVar27 = (ulong *)((long)puVar6 + 1);
                  local_d0 = puVar6;
                }
              } while (!bVar49);
              uVar43 = (ulong)(*(long *)((long)puVar24 + 1) * -0x30e4432345000000) >> 0x34;
              iVar12 = 0;
              puVar14 = (ulong *)((long)puVar24 + 1);
              local_e8 = (ulong *)piVar48;
            }
          }
LAB_0035d8f5:
          local_d0 = puVar27;
        } while (iVar12 == 0);
        local_c0 = local_a0;
        dest = (char *)local_d0;
        if (1 < iVar12 - 2U) goto LAB_0035e21a;
      }
      pcVar22 = source + ((ulong)(uint)inputSize - (long)local_c0);
      local_b0 = (int *)((long)dest + (long)(pcVar22 + (ulong)(pcVar22 + 0xf0) / 0xff + 1));
      if (local_b0 <= pcVar26) {
        puVar31 = (ulong *)dest;
        if (pcVar22 < (char *)0xf) {
LAB_00360427:
          *(char *)puVar31 = (char)pcVar22 << 4;
        }
        else {
          pcVar45 = pcVar22 + -0xf;
          *dest = -0x10;
          puVar31 = (ulong *)((long)dest + 1);
          if ((char *)0xfe < pcVar45) {
            uVar43 = (ulong)(pcVar22 + -0x10e) / 0xff;
            memset(puVar31,0xff,uVar43 + 1);
            puVar31 = (ulong *)((long)dest + uVar43 + 2);
            pcVar45 = pcVar22 + uVar43 * -0xff + -0x10e;
          }
          *(char *)puVar31 = (char)pcVar45;
        }
LAB_0036047e:
        memcpy((char *)((long)puVar31 + 1),local_c0,(size_t)pcVar22);
        dest = (char *)((long)puVar31 + (long)(pcVar22 + 1));
      }
    }
    else {
LAB_0035e20c:
      if (0x7e000000 < (uint)inputSize) goto LAB_0035e21a;
      if (inputSize == 0) goto LAB_0035f399;
      uVar10 = (LZ4_stream->internal_donotuse).currentOffset;
      piVar17 = (int *)(LZ4_stream->internal_donotuse).dictionary;
      lVar25 = uVar43 + (long)piVar17;
      lVar42 = lVar25 - (ulong)uVar10;
      if (piVar17 == (int *)0x0) {
        lVar42 = 0;
      }
      pcVar26 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar20 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar10 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < inputSize) {
        lVar35 = (long)source - (ulong)uVar10;
        puVar31 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        if (piVar17 == (int *)0x0) {
          lVar25 = 0;
        }
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar10;
        puVar14 = (ulong *)(source + 1);
        uVar43 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
        puVar5 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
        iVar19 = 0;
        piVar38 = (int *)source;
        local_c8 = (ulong *)dest;
        do {
          uVar13 = 1;
          uVar20 = iVar21 << 6;
          while( true ) {
            puVar27 = (ulong *)((ulong)uVar13 + (long)puVar14);
            iVar23 = (int)puVar14;
            iVar34 = (int)lVar35;
            if (source + ((ulong)(uint)inputSize - 0xb) < puVar27) {
              iVar12 = 2;
            }
            else {
              uVar29 = iVar23 - iVar34;
              uVar13 = *(uint *)((long)LZ4_stream + uVar43 * 4);
              lVar1 = lVar35;
              if (uVar13 < uVar10) {
                lVar1 = lVar42;
              }
              local_d8 = (long *)(lVar1 + (ulong)uVar13);
              piVar38 = (int *)source;
              if (uVar13 < uVar10) {
                piVar38 = piVar17;
              }
              uVar44 = *puVar27 * -0x30e4432345000000 >> 0x34;
              *(uint *)((long)LZ4_stream + uVar43 * 4) = uVar29;
              iVar12 = 8;
              uVar43 = uVar44;
              if (uVar29 <= uVar13 + 0xffff) {
                if (*(int *)local_d8 == (int)*puVar14) {
                  iVar19 = uVar29 - uVar13;
                  iVar12 = 7;
                }
                else {
                  iVar12 = 0;
                }
              }
            }
            if ((iVar12 != 0) && (iVar12 != 8)) break;
            uVar13 = uVar20 >> 6;
            uVar20 = uVar20 + 1;
            puVar14 = puVar27;
          }
          if (iVar12 == 7) {
            iVar12 = 0;
          }
          puVar27 = local_c8;
          if (iVar12 == 0) {
            uVar13 = iVar23 - (int)local_c0;
            lVar1 = 0;
            cVar2 = (char)puVar14 * '\x10' + (char)local_c0 * -0x10;
            uVar20 = uVar13 - 0xf;
            do {
              uVar29 = uVar20;
              cVar33 = cVar2;
              lVar39 = lVar1;
              piVar48 = (int *)((long)local_d8 + lVar39);
              puVar24 = (ulong *)(lVar39 + (long)puVar14);
              if ((piVar48 <= piVar38) || (puVar24 <= local_c0)) break;
              lVar1 = lVar39 + -1;
              cVar2 = cVar33 + -0x10;
              uVar20 = uVar29 - 1;
            } while (*(char *)((long)puVar14 + lVar39 + -1) ==
                     *(char *)((long)local_d8 + lVar39 + -1));
            iVar12 = (int)lVar39;
            uVar44 = (ulong)(uint)((iVar23 - (int)local_c0) + iVar12);
            puVar27 = (ulong *)((long)local_c8 + 1);
            pcVar22 = (char *)((long)local_c8 +
                              ((ulong)uVar13 + lVar39 & 0xffffffff) / 0xff + uVar44 + 9);
            if (pcVar26 < pcVar22) {
              iVar12 = 1;
            }
            else {
              if ((uint)((ulong)uVar13 + lVar39) < 0xf) {
                *(char *)local_c8 = cVar33;
                puVar14 = puVar27;
              }
              else {
                uVar4 = (ulong)(uVar13 - 0xf) + lVar39;
                *(char *)local_c8 = -0x10;
                if (0xfe < (int)uVar4) {
                  if (0x1fc < (int)uVar29) {
                    uVar29 = 0x1fd;
                  }
                  uVar20 = (uVar13 - uVar29) + iVar12 + 0xef;
                  uVar4 = (ulong)uVar20 / 0xff;
                  memset(puVar27,0xff,(ulong)(uVar20 / 0xff + 1));
                  puVar27 = (ulong *)((long)local_c8 + uVar4 + 2);
                  uVar4 = (ulong)((uVar13 - 0x10e) + iVar12 + (int)uVar4 * -0xff);
                }
                *(char *)puVar27 = (char)uVar4;
                puVar14 = (ulong *)((long)puVar27 + 1);
              }
              puVar27 = (ulong *)(uVar44 + (long)puVar14);
              puVar6 = local_c0;
              do {
                *puVar14 = *puVar6;
                puVar14 = puVar14 + 1;
                puVar6 = puVar6 + 1;
              } while (puVar14 < puVar27);
              iVar12 = 0;
            }
            puVar14 = puVar24;
            local_d8 = (long *)piVar48;
            if (pcVar22 <= pcVar26) {
              do {
                *(short *)puVar27 = (short)iVar19;
                if (piVar38 == piVar17) {
                  puVar14 = (ulong *)((lVar25 - (long)local_d8) + (long)puVar24);
                  if (puVar31 < puVar14) {
                    puVar14 = puVar31;
                  }
                  puVar6 = (ulong *)((long)puVar24 + 4);
                  puVar15 = (ulong *)((long)local_d8 + 4);
                  puVar16 = puVar6;
                  puVar41 = puVar15;
                  if (puVar6 < (ulong *)((long)puVar14 - 7U)) {
                    uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)((long)local_d8 + 4);
                    uVar44 = 0;
                    if (uVar4 != 0) {
                      for (; (uVar4 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar44 = uVar44 >> 3 & 0x1fffffff;
                    puVar16 = (ulong *)((long)puVar24 + 0xc);
                    puVar41 = (ulong *)((long)local_d8 + 0xc);
                    if (*(ulong *)((long)local_d8 + 4) == *(ulong *)((long)puVar24 + 4))
                    goto LAB_0035ef90;
                  }
                  else {
LAB_0035ef90:
                    do {
                      puVar15 = puVar41;
                      if ((ulong *)((long)puVar14 - 7U) <= puVar16) {
                        if ((puVar16 < (ulong *)((long)puVar14 - 3U)) &&
                           ((int)*puVar15 == (int)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 4);
                          puVar15 = (ulong *)((long)puVar15 + 4);
                        }
                        if ((puVar16 < (ulong *)((long)puVar14 - 1U)) &&
                           ((short)*puVar15 == (short)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 2);
                          puVar15 = (ulong *)((long)puVar15 + 2);
                        }
                        if (puVar16 < puVar14) {
                          uVar44 = *puVar15;
                          puVar15 = (ulong *)CONCAT71((int7)((ulong)puVar15 >> 8),(char)uVar44);
                          puVar16 = (ulong *)((long)puVar16 +
                                             (ulong)((char)uVar44 == (char)*puVar16));
                        }
                        uVar44 = (ulong)(uint)((int)puVar16 - (int)puVar6);
                        goto LAB_0035efcb;
                      }
                      uVar44 = *puVar15;
                      uVar4 = *puVar16;
                      uVar36 = uVar4 ^ uVar44;
                      uVar40 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      iVar23 = (int)puVar16;
                      puVar15 = puVar15 + 1;
                      puVar16 = puVar16 + 1;
                      puVar41 = puVar15;
                    } while (uVar44 == uVar4);
                    uVar44 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar6);
                  }
LAB_0035efcb:
                  uVar20 = (uint)uVar44;
                  puVar24 = (ulong *)((long)puVar24 + uVar44 + 4);
                  if (puVar24 == puVar14) {
                    puVar16 = puVar14;
                    puVar6 = (ulong *)source;
                    if (puVar14 < puVar5) {
                      uVar44 = *(ulong *)source;
                      uVar4 = *puVar14;
                      uVar40 = 0;
                      if ((uVar4 ^ uVar44) != 0) {
                        for (; ((uVar4 ^ uVar44) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      puVar15 = (ulong *)(uVar40 >> 3 & 0x1fffffff);
                      uVar13 = (uint)puVar15;
                      if (uVar44 == uVar4) {
                        puVar6 = (ulong *)(source + (ulong)(uVar44 == uVar4) * 8);
                        puVar16 = puVar14 + (uVar44 == uVar4);
                        goto LAB_0035f03b;
                      }
                    }
                    else {
LAB_0035f03b:
                      do {
                        if (puVar5 <= puVar16) {
                          if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) &&
                             ((int)*puVar6 == (int)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 4);
                            puVar6 = (ulong *)((long)puVar6 + 4);
                          }
                          if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
                             ((short)*puVar6 == (short)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 2);
                            puVar6 = (ulong *)((long)puVar6 + 2);
                          }
                          if (puVar16 < puVar31) {
                            puVar16 = (ulong *)((long)puVar16 +
                                               (ulong)((char)*puVar6 == (char)*puVar16));
                          }
                          uVar13 = (int)puVar16 - (int)puVar14;
                          break;
                        }
                        uVar44 = *puVar6;
                        uVar40 = *puVar16 ^ uVar44;
                        uVar4 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                          }
                        }
                        puVar41 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar16);
                        puVar6 = puVar6 + 1;
                        bVar49 = uVar44 == *puVar16;
                        puVar16 = puVar16 + 1;
                        if (!bVar49) {
                          puVar16 = puVar41;
                        }
                        puVar15 = (ulong *)((ulong)puVar15 & 0xffffffff);
                        if (!bVar49) {
                          puVar15 = (ulong *)(ulong)(uint)((int)puVar41 - (int)puVar14);
                        }
                        uVar13 = (uint)puVar15;
                      } while (bVar49);
                    }
                    uVar20 = uVar20 + uVar13;
                    puVar24 = (ulong *)((long)puVar24 + (ulong)uVar13);
                  }
                }
                else {
                  puVar14 = (ulong *)((long)puVar24 + 4);
                  puVar6 = (ulong *)((long)local_d8 + 4);
                  puVar15 = puVar14;
                  if (puVar14 < puVar5) {
                    uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)((long)local_d8 + 4);
                    uVar44 = 0;
                    if (uVar4 != 0) {
                      for (; (uVar4 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar44 = uVar44 >> 3 & 0x1fffffff;
                    puVar15 = (ulong *)((long)puVar24 + 0xc);
                    puVar6 = (ulong *)((long)local_d8 + 0xc);
                    if (*(ulong *)((long)local_d8 + 4) == *(ulong *)((long)puVar24 + 4))
                    goto LAB_0035eede;
                  }
                  else {
LAB_0035eede:
                    do {
                      if (puVar5 <= puVar15) {
                        if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                           ((int)*puVar6 == (int)*puVar15)) {
                          puVar15 = (ulong *)((long)puVar15 + 4);
                          puVar6 = (ulong *)((long)puVar6 + 4);
                        }
                        if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                           ((short)*puVar6 == (short)*puVar15)) {
                          puVar15 = (ulong *)((long)puVar15 + 2);
                          puVar6 = (ulong *)((long)puVar6 + 2);
                        }
                        if (puVar15 < puVar31) {
                          puVar15 = (ulong *)((long)puVar15 +
                                             (ulong)((char)*puVar6 == (char)*puVar15));
                        }
                        uVar44 = (ulong)(uint)((int)puVar15 - (int)puVar14);
                        goto LAB_0035ef19;
                      }
                      uVar44 = *puVar6;
                      uVar4 = *puVar15;
                      uVar36 = uVar4 ^ uVar44;
                      uVar40 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      iVar23 = (int)puVar15;
                      puVar6 = puVar6 + 1;
                      puVar15 = puVar15 + 1;
                    } while (uVar44 == uVar4);
                    uVar44 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar14);
                  }
LAB_0035ef19:
                  uVar20 = (uint)uVar44;
                  puVar24 = (ulong *)((long)puVar24 + uVar44 + 4);
                }
                puVar6 = (ulong *)((long)puVar27 + 2);
                pcVar22 = (char *)((long)puVar27 + (ulong)(uVar20 + 0xf0) / 0xff + 8);
                if (pcVar22 <= pcVar26) {
                  if (uVar20 < 0xf) {
                    *(char *)local_c8 = (char)*local_c8 + (char)uVar20;
                  }
                  else {
                    *(char *)local_c8 = (char)*local_c8 + '\x0f';
                    uVar13 = uVar20 - 0xf;
                    *(undefined4 *)puVar6 = 0xffffffff;
                    if (0x3fb < uVar13) {
                      uVar20 = uVar20 - 0x40b;
                      memset((char *)((long)puVar27 + 6),0xff,(ulong)((uVar20 / 0x3fc) * 4 + 4));
                      uVar13 = uVar20 % 0x3fc;
                      puVar6 = (ulong *)((long)puVar27 + (ulong)((uVar20 / 0x3fc) * 4) + 6);
                    }
                    pcVar45 = (char *)((long)puVar6 + (ulong)uVar13 / 0xff);
                    puVar6 = (ulong *)(pcVar45 + 1);
                    *pcVar45 = (char)((ulong)uVar13 * 0x8080808081 >> 0x27);
                  }
                }
                puVar14 = puVar24;
                puVar27 = puVar6;
                if (pcVar26 < pcVar22) {
                  iVar12 = 1;
                  goto LAB_0035f373;
                }
                local_c0 = puVar24;
                if (source + ((ulong)(uint)inputSize - 0xb) <= puVar24) {
                  iVar12 = 3;
                  goto LAB_0035f373;
                }
                *(int *)((long)LZ4_stream +
                        ((ulong)(*(long *)((long)puVar24 + -2) * -0x30e4432345000000) >> 0x34) * 4)
                     = ((int)puVar24 + -2) - iVar34;
                uVar44 = *puVar24 * -0x30e4432345000000 >> 0x34;
                uVar13 = (int)puVar24 - iVar34;
                uVar20 = *(uint *)((long)LZ4_stream + uVar44 * 4);
                lVar1 = lVar35;
                if (uVar20 < uVar10) {
                  lVar1 = lVar42;
                }
                local_d8 = (long *)((ulong)uVar20 + lVar1);
                piVar38 = (int *)source;
                if (uVar20 < uVar10) {
                  piVar38 = piVar17;
                }
                *(uint *)((long)LZ4_stream + uVar44 * 4) = uVar13;
                bVar49 = true;
                if ((uVar13 <= uVar20 + 0xffff) && (*(int *)local_d8 == (int)*puVar24)) {
                  *(char *)puVar6 = '\0';
                  iVar19 = uVar13 - uVar20;
                  bVar49 = false;
                  puVar27 = (ulong *)((long)puVar6 + 1);
                  local_c8 = puVar6;
                }
              } while (!bVar49);
              uVar43 = (ulong)(*(long *)((long)puVar24 + 1) * -0x30e4432345000000) >> 0x34;
              iVar12 = 0;
              puVar14 = (ulong *)((long)puVar24 + 1);
            }
          }
LAB_0035f373:
          local_c8 = puVar27;
        } while (iVar12 == 0);
        dest = (char *)local_c8;
        if (1 < iVar12 - 2U) goto LAB_0035fc1c;
      }
      pcVar22 = source + ((ulong)(uint)inputSize - (long)local_c0);
      local_b0 = (int *)((long)dest + (long)(pcVar22 + (ulong)(pcVar22 + 0xf0) / 0xff + 1));
      if (local_b0 <= pcVar26) {
        puVar31 = (ulong *)dest;
        if (pcVar22 < (char *)0xf) goto LAB_00360427;
        pcVar45 = pcVar22 + -0xf;
        *dest = -0x10;
        puVar31 = (ulong *)((long)dest + 1);
        if ((char *)0xfe < pcVar45) {
          uVar43 = (ulong)(pcVar22 + -0x10e) / 0xff;
          memset(puVar31,0xff,uVar43 + 1);
          puVar31 = (ulong *)((long)dest + uVar43 + 2);
          pcVar45 = pcVar22 + uVar43 * -0xff + -0x10e;
        }
        *(char *)puVar31 = (char)pcVar45;
        goto LAB_0036047e;
      }
    }
    iVar21 = 0;
    if (local_b0 <= pcVar26) {
      iVar21 = (int)dest - iVar47;
    }
  }
  else {
    if (inputSize < 0x1001) {
      if (0x7e000000 < (uint)inputSize) goto LAB_0035e21a;
      if (inputSize != 0) {
        uVar20 = (LZ4_stream->internal_donotuse).currentOffset;
        piVar17 = (int *)__src->dictionary;
        uVar10 = __src->currentOffset;
        lVar25 = (ulong)__src->dictSize + (long)piVar17;
        lVar42 = lVar25 - (ulong)uVar10;
        if (piVar17 == (int *)0x0) {
          lVar42 = 0;
        }
        pcVar26 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictCtx = (LZ4_stream_t_internal *)0x0;
        (LZ4_stream->internal_donotuse).dictSize = inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar20 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        local_d0 = (ulong *)source;
        if (0xc < inputSize) {
          lVar35 = (long)source - (ulong)uVar20;
          iVar19 = uVar20 - uVar10;
          puVar31 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
          if (piVar17 == (int *)0x0) {
            lVar25 = 0;
          }
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar20;
          puVar14 = (ulong *)(source + 1);
          uVar43 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
          puVar5 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
          iVar34 = 0;
          local_f0 = (ulong *)dest;
          local_b0 = (int *)source;
          do {
            uVar13 = 1;
            uVar10 = iVar21 << 6;
            while( true ) {
              puVar27 = (ulong *)((ulong)uVar13 + (long)puVar14);
              iVar23 = (int)puVar14;
              iVar12 = (int)lVar35;
              if (source + ((ulong)(uint)inputSize - 0xb) < puVar27) {
                iVar11 = 2;
              }
              else {
                uVar13 = *(uint *)((long)LZ4_stream + uVar43 * 4);
                if (uVar13 < uVar20) {
                  uVar13 = iVar19 + __src->hashTable[uVar43];
                  local_b8 = (int *)((ulong)__src->hashTable[uVar43] + lVar42);
                  local_b0 = piVar17;
                }
                else {
                  local_b8 = (int *)(lVar35 + (ulong)uVar13);
                  local_b0 = (int *)source;
                }
                uVar29 = iVar23 - iVar12;
                uVar44 = *puVar27 * -0x30e4432345000000 >> 0x34;
                *(uint *)((long)LZ4_stream + uVar43 * 4) = uVar29;
                iVar11 = 8;
                uVar43 = uVar44;
                if (uVar29 <= uVar13 + 0xffff) {
                  if (*local_b8 == (int)*puVar14) {
                    iVar34 = uVar29 - uVar13;
                    iVar11 = 7;
                  }
                  else {
                    iVar11 = 0;
                  }
                }
              }
              if ((iVar11 != 0) && (iVar11 != 8)) break;
              uVar13 = uVar10 >> 6;
              uVar10 = uVar10 + 1;
              puVar14 = puVar27;
            }
            if (iVar11 == 7) {
              iVar11 = 0;
            }
            puVar27 = local_f0;
            if (iVar11 == 0) {
              uVar13 = iVar23 - (int)local_d0;
              lVar1 = 0;
              cVar2 = (char)puVar14 * '\x10' + (char)local_d0 * -0x10;
              uVar10 = uVar13 - 0xf;
              do {
                uVar29 = uVar10;
                cVar33 = cVar2;
                lVar39 = lVar1;
                piVar38 = (int *)((long)local_b8 + lVar39);
                puVar24 = (ulong *)(lVar39 + (long)puVar14);
                if ((piVar38 <= local_b0) || (puVar24 <= local_d0)) break;
                lVar1 = lVar39 + -1;
                cVar2 = cVar33 + -0x10;
                uVar10 = uVar29 - 1;
              } while (*(char *)((long)puVar14 + lVar39 + -1) ==
                       *(char *)((long)local_b8 + lVar39 + -1));
              iVar11 = (int)lVar39;
              uVar44 = (ulong)(uint)((iVar23 - (int)local_d0) + iVar11);
              puVar27 = (ulong *)((long)local_f0 + 1);
              pcVar22 = (char *)((long)local_f0 +
                                ((ulong)uVar13 + lVar39 & 0xffffffff) / 0xff + uVar44 + 9);
              if (pcVar26 < pcVar22) {
                iVar11 = 1;
              }
              else {
                if ((uint)((ulong)uVar13 + lVar39) < 0xf) {
                  *(char *)local_f0 = cVar33;
                  puVar14 = puVar27;
                }
                else {
                  uVar4 = (ulong)(uVar13 - 0xf) + lVar39;
                  *(char *)local_f0 = -0x10;
                  if (0xfe < (int)uVar4) {
                    if (0x1fc < (int)uVar29) {
                      uVar29 = 0x1fd;
                    }
                    uVar10 = (uVar13 - uVar29) + iVar11 + 0xef;
                    memset(puVar27,0xff,(ulong)(uVar10 / 0xff + 1));
                    puVar27 = (ulong *)((long)local_f0 + (ulong)uVar10 / 0xff + 2);
                    uVar4 = (ulong)((uVar13 - 0x10e) + iVar11 + uVar10 / 0xff);
                  }
                  *(char *)puVar27 = (char)uVar4;
                  puVar14 = (ulong *)((long)puVar27 + 1);
                }
                puVar27 = (ulong *)(uVar44 + (long)puVar14);
                puVar6 = local_d0;
                do {
                  *puVar14 = *puVar6;
                  puVar14 = puVar14 + 1;
                  puVar6 = puVar6 + 1;
                } while (puVar14 < puVar27);
                iVar11 = 0;
              }
              puVar14 = puVar24;
              local_b8 = piVar38;
              if (pcVar22 <= pcVar26) {
                do {
                  *(short *)puVar27 = (short)iVar34;
                  if (local_b0 == piVar17) {
                    puVar14 = (ulong *)((lVar25 - (long)local_b8) + (long)puVar24);
                    if (puVar31 < puVar14) {
                      puVar14 = puVar31;
                    }
                    puVar6 = (ulong *)((long)puVar24 + 4);
                    puVar15 = (ulong *)(local_b8 + 1);
                    puVar16 = puVar6;
                    puVar41 = puVar15;
                    if (puVar6 < (ulong *)((long)puVar14 - 7U)) {
                      uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)(local_b8 + 1);
                      uVar44 = 0;
                      if (uVar4 != 0) {
                        for (; (uVar4 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                        }
                      }
                      uVar44 = uVar44 >> 3 & 0x1fffffff;
                      puVar16 = (ulong *)((long)puVar24 + 0xc);
                      puVar41 = (ulong *)(local_b8 + 3);
                      if (*(ulong *)(local_b8 + 1) == *(ulong *)((long)puVar24 + 4))
                      goto LAB_0035de00;
                    }
                    else {
LAB_0035de00:
                      do {
                        puVar15 = puVar41;
                        if ((ulong *)((long)puVar14 - 7U) <= puVar16) {
                          if ((puVar16 < (ulong *)((long)puVar14 - 3U)) &&
                             ((int)*puVar15 == (int)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 4);
                            puVar15 = (ulong *)((long)puVar15 + 4);
                          }
                          if ((puVar16 < (ulong *)((long)puVar14 - 1U)) &&
                             ((short)*puVar15 == (short)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 2);
                            puVar15 = (ulong *)((long)puVar15 + 2);
                          }
                          if (puVar16 < puVar14) {
                            uVar44 = *puVar15;
                            puVar15 = (ulong *)CONCAT71((int7)((ulong)puVar15 >> 8),(char)uVar44);
                            puVar16 = (ulong *)((long)puVar16 +
                                               (ulong)((char)uVar44 == (char)*puVar16));
                          }
                          uVar44 = (ulong)(uint)((int)puVar16 - (int)puVar6);
                          goto LAB_0035de3b;
                        }
                        uVar44 = *puVar15;
                        uVar4 = *puVar16;
                        uVar36 = uVar4 ^ uVar44;
                        uVar40 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        iVar23 = (int)puVar16;
                        puVar15 = puVar15 + 1;
                        puVar16 = puVar16 + 1;
                        puVar41 = puVar15;
                      } while (uVar44 == uVar4);
                      uVar44 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar6);
                    }
LAB_0035de3b:
                    uVar10 = (uint)uVar44;
                    puVar24 = (ulong *)((long)puVar24 + uVar44 + 4);
                    if (puVar24 == puVar14) {
                      puVar16 = puVar14;
                      puVar6 = (ulong *)source;
                      if (puVar14 < puVar5) {
                        uVar44 = *(ulong *)source;
                        uVar4 = *puVar14;
                        uVar40 = 0;
                        if ((uVar4 ^ uVar44) != 0) {
                          for (; ((uVar4 ^ uVar44) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        puVar15 = (ulong *)(uVar40 >> 3 & 0x1fffffff);
                        uVar13 = (uint)puVar15;
                        if (uVar44 == uVar4) {
                          puVar6 = (ulong *)(source + (ulong)(uVar44 == uVar4) * 8);
                          puVar16 = puVar14 + (uVar44 == uVar4);
                          goto LAB_0035de97;
                        }
                      }
                      else {
LAB_0035de97:
                        do {
                          if (puVar5 <= puVar16) {
                            if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) &&
                               ((int)*puVar6 == (int)*puVar16)) {
                              puVar16 = (ulong *)((long)puVar16 + 4);
                              puVar6 = (ulong *)((long)puVar6 + 4);
                            }
                            if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
                               ((short)*puVar6 == (short)*puVar16)) {
                              puVar16 = (ulong *)((long)puVar16 + 2);
                              puVar6 = (ulong *)((long)puVar6 + 2);
                            }
                            if (puVar16 < puVar31) {
                              puVar16 = (ulong *)((long)puVar16 +
                                                 (ulong)((char)*puVar6 == (char)*puVar16));
                            }
                            uVar13 = (int)puVar16 - (int)puVar14;
                            break;
                          }
                          uVar44 = *puVar6;
                          uVar40 = *puVar16 ^ uVar44;
                          uVar4 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                            }
                          }
                          puVar41 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar16);
                          puVar6 = puVar6 + 1;
                          bVar49 = uVar44 == *puVar16;
                          puVar16 = puVar16 + 1;
                          if (!bVar49) {
                            puVar16 = puVar41;
                          }
                          puVar15 = (ulong *)((ulong)puVar15 & 0xffffffff);
                          if (!bVar49) {
                            puVar15 = (ulong *)(ulong)(uint)((int)puVar41 - (int)puVar14);
                          }
                          uVar13 = (uint)puVar15;
                        } while (bVar49);
                      }
                      uVar10 = uVar10 + uVar13;
                      puVar24 = (ulong *)((long)puVar24 + (ulong)uVar13);
                    }
                  }
                  else {
                    puVar14 = (ulong *)((long)puVar24 + 4);
                    puVar6 = (ulong *)(local_b8 + 1);
                    puVar15 = puVar14;
                    if (puVar14 < puVar5) {
                      uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)(local_b8 + 1);
                      uVar44 = 0;
                      if (uVar4 != 0) {
                        for (; (uVar4 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                        }
                      }
                      uVar44 = uVar44 >> 3 & 0x1fffffff;
                      puVar15 = (ulong *)((long)puVar24 + 0xc);
                      puVar6 = (ulong *)(local_b8 + 3);
                      if (*(ulong *)(local_b8 + 1) == *(ulong *)((long)puVar24 + 4))
                      goto LAB_0035dd53;
                    }
                    else {
LAB_0035dd53:
                      do {
                        if (puVar5 <= puVar15) {
                          if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                             ((int)*puVar6 == (int)*puVar15)) {
                            puVar15 = (ulong *)((long)puVar15 + 4);
                            puVar6 = (ulong *)((long)puVar6 + 4);
                          }
                          if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                             ((short)*puVar6 == (short)*puVar15)) {
                            puVar15 = (ulong *)((long)puVar15 + 2);
                            puVar6 = (ulong *)((long)puVar6 + 2);
                          }
                          if (puVar15 < puVar31) {
                            puVar15 = (ulong *)((long)puVar15 +
                                               (ulong)((char)*puVar6 == (char)*puVar15));
                          }
                          uVar44 = (ulong)(uint)((int)puVar15 - (int)puVar14);
                          goto LAB_0035dd8e;
                        }
                        uVar44 = *puVar6;
                        uVar4 = *puVar15;
                        uVar36 = uVar4 ^ uVar44;
                        uVar40 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        iVar23 = (int)puVar15;
                        puVar6 = puVar6 + 1;
                        puVar15 = puVar15 + 1;
                      } while (uVar44 == uVar4);
                      uVar44 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar14)
                      ;
                    }
LAB_0035dd8e:
                    uVar10 = (uint)uVar44;
                    puVar24 = (ulong *)((long)puVar24 + uVar44 + 4);
                  }
                  puVar6 = (ulong *)((long)puVar27 + 2);
                  pcVar22 = (char *)((long)puVar27 + (ulong)(uVar10 + 0xf0) / 0xff + 8);
                  if (pcVar22 <= pcVar26) {
                    if (uVar10 < 0xf) {
                      *(char *)local_f0 = (char)*local_f0 + (char)uVar10;
                    }
                    else {
                      *(char *)local_f0 = (char)*local_f0 + '\x0f';
                      uVar13 = uVar10 - 0xf;
                      *(undefined4 *)puVar6 = 0xffffffff;
                      if (0x3fb < uVar13) {
                        uVar10 = uVar10 - 0x40b;
                        memset((char *)((long)puVar27 + 6),0xff,(ulong)((uVar10 / 0x3fc) * 4 + 4));
                        uVar13 = uVar10 % 0x3fc;
                        puVar6 = (ulong *)((long)puVar27 + (ulong)((uVar10 / 0x3fc) * 4) + 6);
                      }
                      pcVar45 = (char *)((long)puVar6 + (ulong)uVar13 / 0xff);
                      puVar6 = (ulong *)(pcVar45 + 1);
                      *pcVar45 = (char)((ulong)uVar13 * 0x8080808081 >> 0x27);
                    }
                  }
                  puVar14 = puVar24;
                  puVar27 = puVar6;
                  if (pcVar26 < pcVar22) {
                    iVar11 = 1;
                    goto LAB_0035e1e6;
                  }
                  local_d0 = puVar24;
                  if (source + ((ulong)(uint)inputSize - 0xb) <= puVar24) {
                    iVar11 = 3;
                    goto LAB_0035e1e6;
                  }
                  *(int *)((long)LZ4_stream +
                          ((ulong)(*(long *)((long)puVar24 + -2) * -0x30e4432345000000) >> 0x34) * 4
                          ) = ((int)puVar24 + -2) - iVar12;
                  uVar44 = *puVar24 * -0x30e4432345000000 >> 0x34;
                  uVar10 = *(uint *)((long)LZ4_stream + uVar44 * 4);
                  if (uVar10 < uVar20) {
                    uVar10 = iVar19 + __src->hashTable[uVar44];
                    local_b8 = (int *)((ulong)__src->hashTable[uVar44] + lVar42);
                    local_b0 = piVar17;
                  }
                  else {
                    local_b8 = (int *)(lVar35 + (ulong)uVar10);
                    local_b0 = (int *)source;
                  }
                  uVar13 = (int)puVar24 - iVar12;
                  *(uint *)((long)LZ4_stream + uVar44 * 4) = uVar13;
                  bVar49 = true;
                  if ((uVar13 <= uVar10 + 0xffff) && (*local_b8 == (int)*puVar24)) {
                    *(char *)puVar6 = '\0';
                    iVar34 = uVar13 - uVar10;
                    bVar49 = false;
                    puVar27 = (ulong *)((long)puVar6 + 1);
                    local_f0 = puVar6;
                  }
                } while (!bVar49);
                uVar43 = (ulong)(*(long *)((long)puVar24 + 1) * -0x30e4432345000000) >> 0x34;
                iVar11 = 0;
                puVar14 = (ulong *)((long)puVar24 + 1);
              }
            }
LAB_0035e1e6:
            local_f0 = puVar27;
          } while (iVar11 == 0);
          dest = (char *)local_f0;
          if (1 < iVar11 - 2U) goto LAB_0035fc1c;
        }
        pcVar45 = source + ((ulong)(uint)inputSize - (long)local_d0);
        pcVar22 = (char *)((long)dest + (long)(pcVar45 + (ulong)(pcVar45 + 0xf0) / 0xff + 1));
        if (pcVar22 <= pcVar26) {
          if (pcVar45 < (char *)0xf) {
            *dest = (char)pcVar45 << 4;
          }
          else {
            pcVar7 = pcVar45 + -0xf;
            *dest = -0x10;
            puVar31 = (ulong *)((long)dest + 1);
            if ((char *)0xfe < pcVar7) {
              uVar43 = (ulong)(pcVar45 + -0x10e) / 0xff;
              memset(puVar31,0xff,uVar43 + 1);
              puVar31 = (ulong *)((long)dest + uVar43 + 2);
              pcVar7 = pcVar45 + uVar43 * -0xff + -0x10e;
            }
            *(char *)puVar31 = (char)pcVar7;
            dest = (char *)puVar31;
          }
          memcpy((char *)((long)dest + 1),local_d0,(size_t)pcVar45);
          dest = (char *)((long)dest + (long)(pcVar45 + 1));
        }
        iVar21 = 0;
        if (pcVar22 <= pcVar26) {
          iVar21 = (int)dest - iVar47;
        }
        goto LAB_0035e21e;
      }
LAB_0035f399:
      iVar21 = 0;
      if (0 < maxOutputSize) {
        *dest = '\0';
        iVar21 = 1;
      }
      goto LAB_0035e21e;
    }
    memcpy(LZ4_stream,__src,0x4020);
    if ((uint)inputSize < 0x7e000001) {
      uVar20 = (LZ4_stream->internal_donotuse).currentOffset;
      lVar35 = (long)source - (ulong)uVar20;
      piVar17 = (int *)(LZ4_stream->internal_donotuse).dictionary;
      lVar42 = (ulong)(LZ4_stream->internal_donotuse).dictSize + (long)piVar17;
      lVar25 = lVar42 - (ulong)uVar20;
      if (piVar17 == (int *)0x0) {
        lVar42 = 0;
      }
      puVar31 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
      if (piVar17 == (int *)0x0) {
        lVar25 = 0;
      }
      pcVar26 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize =
           (LZ4_stream->internal_donotuse).dictSize + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar20 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar20;
      puVar5 = (ulong *)(source + 1);
      uVar43 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
      puVar14 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
      iVar19 = 0;
      piVar38 = (int *)source;
      local_e8 = (ulong *)dest;
      do {
        uVar13 = 1;
        uVar10 = iVar21 << 6;
        while( true ) {
          puVar27 = (ulong *)((ulong)uVar13 + (long)puVar5);
          iVar23 = (int)puVar5;
          iVar34 = (int)lVar35;
          if (source + ((ulong)(uint)inputSize - 0xb) < puVar27) {
            iVar12 = 2;
          }
          else {
            uVar29 = iVar23 - iVar34;
            uVar13 = *(uint *)((long)LZ4_stream + uVar43 * 4);
            lVar1 = lVar35;
            if (uVar13 < uVar20) {
              lVar1 = lVar25;
            }
            local_d8 = (long *)(lVar1 + (ulong)uVar13);
            piVar38 = (int *)source;
            if (uVar13 < uVar20) {
              piVar38 = piVar17;
            }
            uVar44 = *puVar27 * -0x30e4432345000000 >> 0x34;
            *(uint *)((long)LZ4_stream + uVar43 * 4) = uVar29;
            iVar12 = 8;
            uVar43 = uVar44;
            if (uVar29 <= uVar13 + 0xffff) {
              if (*(int *)local_d8 == (int)*puVar5) {
                iVar19 = uVar29 - uVar13;
                iVar12 = 7;
              }
              else {
                iVar12 = 0;
              }
            }
          }
          if ((iVar12 != 0) && (iVar12 != 8)) break;
          uVar13 = uVar10 >> 6;
          uVar10 = uVar10 + 1;
          puVar5 = puVar27;
        }
        if (iVar12 == 7) {
          iVar12 = 0;
        }
        puVar27 = local_e8;
        if (iVar12 == 0) {
          uVar13 = iVar23 - (int)local_c0;
          lVar1 = 0;
          cVar2 = (char)puVar5 * '\x10' + (char)local_c0 * -0x10;
          uVar10 = uVar13 - 0xf;
          do {
            uVar29 = uVar10;
            cVar33 = cVar2;
            lVar39 = lVar1;
            piVar48 = (int *)((long)local_d8 + lVar39);
            puVar24 = (ulong *)(lVar39 + (long)puVar5);
            if ((piVar48 <= piVar38) || (puVar24 <= local_c0)) break;
            lVar1 = lVar39 + -1;
            cVar2 = cVar33 + -0x10;
            uVar10 = uVar29 - 1;
          } while (*(char *)((long)puVar5 + lVar39 + -1) == *(char *)((long)local_d8 + lVar39 + -1))
          ;
          iVar12 = (int)lVar39;
          uVar44 = (ulong)(uint)((iVar23 - (int)local_c0) + iVar12);
          puVar27 = (ulong *)((long)local_e8 + 1);
          pcVar22 = (char *)((long)local_e8 +
                            ((ulong)uVar13 + lVar39 & 0xffffffff) / 0xff + uVar44 + 9);
          if (pcVar26 < pcVar22) {
            iVar12 = 1;
          }
          else {
            if ((uint)((ulong)uVar13 + lVar39) < 0xf) {
              *(char *)local_e8 = cVar33;
              puVar5 = puVar27;
            }
            else {
              uVar4 = (ulong)(uVar13 - 0xf) + lVar39;
              *(char *)local_e8 = -0x10;
              if (0xfe < (int)uVar4) {
                if (0x1fc < (int)uVar29) {
                  uVar29 = 0x1fd;
                }
                uVar10 = (uVar13 - uVar29) + iVar12 + 0xef;
                uVar4 = (ulong)uVar10 / 0xff;
                memset(puVar27,0xff,(ulong)(uVar10 / 0xff + 1));
                puVar27 = (ulong *)((long)local_e8 + uVar4 + 2);
                uVar4 = (ulong)((uVar13 - 0x10e) + iVar12 + (int)uVar4 * -0xff);
              }
              *(char *)puVar27 = (char)uVar4;
              puVar5 = (ulong *)((long)puVar27 + 1);
            }
            puVar27 = (ulong *)(uVar44 + (long)puVar5);
            puVar6 = local_c0;
            do {
              *puVar5 = *puVar6;
              puVar5 = puVar5 + 1;
              puVar6 = puVar6 + 1;
            } while (puVar5 < puVar27);
            iVar12 = 0;
          }
          puVar5 = puVar24;
          local_d8 = (long *)piVar48;
          if (pcVar22 <= pcVar26) {
            do {
              *(short *)puVar27 = (short)iVar19;
              if (piVar38 == piVar17) {
                puVar5 = (ulong *)((lVar42 - (long)local_d8) + (long)puVar24);
                if (puVar31 < puVar5) {
                  puVar5 = puVar31;
                }
                puVar6 = (ulong *)((long)puVar24 + 4);
                puVar15 = (ulong *)((long)local_d8 + 4);
                puVar16 = puVar6;
                puVar41 = puVar15;
                if (puVar6 < (ulong *)((long)puVar5 - 7U)) {
                  uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)((long)local_d8 + 4);
                  uVar44 = 0;
                  if (uVar4 != 0) {
                    for (; (uVar4 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar44 = uVar44 >> 3 & 0x1fffffff;
                  puVar16 = (ulong *)((long)puVar24 + 0xc);
                  puVar41 = (ulong *)((long)local_d8 + 0xc);
                  if (*(ulong *)((long)local_d8 + 4) == *(ulong *)((long)puVar24 + 4))
                  goto LAB_0035e6ad;
                }
                else {
LAB_0035e6ad:
                  do {
                    puVar15 = puVar41;
                    if ((ulong *)((long)puVar5 - 7U) <= puVar16) {
                      if ((puVar16 < (ulong *)((long)puVar5 - 3U)) &&
                         ((int)*puVar15 == (int)*puVar16)) {
                        puVar16 = (ulong *)((long)puVar16 + 4);
                        puVar15 = (ulong *)((long)puVar15 + 4);
                      }
                      if ((puVar16 < (ulong *)((long)puVar5 - 1U)) &&
                         ((short)*puVar15 == (short)*puVar16)) {
                        puVar16 = (ulong *)((long)puVar16 + 2);
                        puVar15 = (ulong *)((long)puVar15 + 2);
                      }
                      if (puVar16 < puVar5) {
                        uVar44 = *puVar15;
                        puVar15 = (ulong *)CONCAT71((int7)((ulong)puVar15 >> 8),(char)uVar44);
                        puVar16 = (ulong *)((long)puVar16 + (ulong)((char)uVar44 == (char)*puVar16))
                        ;
                      }
                      uVar44 = (ulong)(uint)((int)puVar16 - (int)puVar6);
                      goto LAB_0035e6e8;
                    }
                    uVar44 = *puVar15;
                    uVar4 = *puVar16;
                    uVar36 = uVar4 ^ uVar44;
                    uVar40 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    iVar23 = (int)puVar16;
                    puVar15 = puVar15 + 1;
                    puVar16 = puVar16 + 1;
                    puVar41 = puVar15;
                  } while (uVar44 == uVar4);
                  uVar44 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar6);
                }
LAB_0035e6e8:
                uVar10 = (uint)uVar44;
                puVar24 = (ulong *)((long)puVar24 + uVar44 + 4);
                if (puVar24 == puVar5) {
                  puVar16 = puVar5;
                  puVar6 = (ulong *)source;
                  if (puVar5 < puVar14) {
                    uVar44 = *(ulong *)source;
                    uVar4 = *puVar5;
                    uVar40 = 0;
                    if ((uVar4 ^ uVar44) != 0) {
                      for (; ((uVar4 ^ uVar44) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    puVar15 = (ulong *)(uVar40 >> 3 & 0x1fffffff);
                    uVar13 = (uint)puVar15;
                    if (uVar44 == uVar4) {
                      puVar6 = (ulong *)(source + (ulong)(uVar44 == uVar4) * 8);
                      puVar16 = puVar5 + (uVar44 == uVar4);
                      goto LAB_0035e8e9;
                    }
                  }
                  else {
LAB_0035e8e9:
                    do {
                      if (puVar14 <= puVar16) {
                        if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) &&
                           ((int)*puVar6 == (int)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 4);
                          puVar6 = (ulong *)((long)puVar6 + 4);
                        }
                        if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
                           ((short)*puVar6 == (short)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 2);
                          puVar6 = (ulong *)((long)puVar6 + 2);
                        }
                        if (puVar16 < puVar31) {
                          puVar16 = (ulong *)((long)puVar16 +
                                             (ulong)((char)*puVar6 == (char)*puVar16));
                        }
                        uVar13 = (int)puVar16 - (int)puVar5;
                        break;
                      }
                      uVar44 = *puVar6;
                      uVar40 = *puVar16 ^ uVar44;
                      uVar4 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                        }
                      }
                      puVar41 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar16);
                      puVar6 = puVar6 + 1;
                      bVar49 = uVar44 == *puVar16;
                      puVar16 = puVar16 + 1;
                      if (!bVar49) {
                        puVar16 = puVar41;
                      }
                      puVar15 = (ulong *)((ulong)puVar15 & 0xffffffff);
                      if (!bVar49) {
                        puVar15 = (ulong *)(ulong)(uint)((int)puVar41 - (int)puVar5);
                      }
                      uVar13 = (uint)puVar15;
                    } while (bVar49);
                  }
                  uVar10 = uVar10 + uVar13;
                  puVar24 = (ulong *)((long)puVar24 + (ulong)uVar13);
                }
              }
              else {
                puVar5 = (ulong *)((long)puVar24 + 4);
                puVar6 = (ulong *)((long)local_d8 + 4);
                puVar15 = puVar5;
                if (puVar5 < puVar14) {
                  uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)((long)local_d8 + 4);
                  uVar44 = 0;
                  if (uVar4 != 0) {
                    for (; (uVar4 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar44 = uVar44 >> 3 & 0x1fffffff;
                  puVar15 = (ulong *)((long)puVar24 + 0xc);
                  puVar6 = (ulong *)((long)local_d8 + 0xc);
                  if (*(ulong *)((long)local_d8 + 4) == *(ulong *)((long)puVar24 + 4))
                  goto LAB_0035e600;
                }
                else {
LAB_0035e600:
                  do {
                    if (puVar14 <= puVar15) {
                      if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                         ((int)*puVar6 == (int)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 4);
                        puVar6 = (ulong *)((long)puVar6 + 4);
                      }
                      if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                         ((short)*puVar6 == (short)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 2);
                        puVar6 = (ulong *)((long)puVar6 + 2);
                      }
                      if (puVar15 < puVar31) {
                        puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar6 == (char)*puVar15)
                                           );
                      }
                      uVar44 = (ulong)(uint)((int)puVar15 - (int)puVar5);
                      goto LAB_0035e63b;
                    }
                    uVar44 = *puVar6;
                    uVar4 = *puVar15;
                    uVar36 = uVar4 ^ uVar44;
                    uVar40 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    iVar23 = (int)puVar15;
                    puVar6 = puVar6 + 1;
                    puVar15 = puVar15 + 1;
                  } while (uVar44 == uVar4);
                  uVar44 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar5);
                }
LAB_0035e63b:
                uVar10 = (uint)uVar44;
                puVar24 = (ulong *)((long)puVar24 + uVar44 + 4);
              }
              puVar6 = (ulong *)((long)puVar27 + 2);
              pcVar22 = (char *)((long)puVar27 + (ulong)(uVar10 + 0xf0) / 0xff + 8);
              if (pcVar22 <= pcVar26) {
                if (uVar10 < 0xf) {
                  *(char *)local_e8 = (char)*local_e8 + (char)uVar10;
                }
                else {
                  *(char *)local_e8 = (char)*local_e8 + '\x0f';
                  uVar13 = uVar10 - 0xf;
                  *(undefined4 *)puVar6 = 0xffffffff;
                  if (0x3fb < uVar13) {
                    uVar10 = uVar10 - 0x40b;
                    memset((char *)((long)puVar27 + 6),0xff,(ulong)((uVar10 / 0x3fc) * 4 + 4));
                    uVar13 = uVar10 % 0x3fc;
                    puVar6 = (ulong *)((long)puVar27 + (ulong)((uVar10 / 0x3fc) * 4) + 6);
                  }
                  pcVar45 = (char *)((long)puVar6 + (ulong)uVar13 / 0xff);
                  puVar6 = (ulong *)(pcVar45 + 1);
                  *pcVar45 = (char)((ulong)uVar13 * 0x8080808081 >> 0x27);
                }
              }
              puVar5 = puVar24;
              puVar27 = puVar6;
              if (pcVar26 < pcVar22) {
                iVar12 = 1;
                goto LAB_0035ea7c;
              }
              local_c0 = puVar24;
              if (source + ((ulong)(uint)inputSize - 0xb) <= puVar24) {
                iVar12 = 3;
                goto LAB_0035ea7c;
              }
              *(int *)((long)LZ4_stream +
                      ((ulong)(*(long *)((long)puVar24 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)puVar24 + -2) - iVar34;
              uVar44 = *puVar24 * -0x30e4432345000000 >> 0x34;
              uVar13 = (int)puVar24 - iVar34;
              uVar10 = *(uint *)((long)LZ4_stream + uVar44 * 4);
              lVar1 = lVar35;
              if (uVar10 < uVar20) {
                lVar1 = lVar25;
              }
              local_d8 = (long *)((ulong)uVar10 + lVar1);
              piVar38 = (int *)source;
              if (uVar10 < uVar20) {
                piVar38 = piVar17;
              }
              *(uint *)((long)LZ4_stream + uVar44 * 4) = uVar13;
              bVar49 = true;
              if ((uVar13 <= uVar10 + 0xffff) && (*(int *)local_d8 == (int)*puVar24)) {
                *(char *)puVar6 = '\0';
                iVar19 = uVar13 - uVar10;
                bVar49 = false;
                puVar27 = (ulong *)((long)puVar6 + 1);
                local_e8 = puVar6;
              }
            } while (!bVar49);
            uVar43 = (ulong)(*(long *)((long)puVar24 + 1) * -0x30e4432345000000) >> 0x34;
            iVar12 = 0;
            puVar5 = (ulong *)((long)puVar24 + 1);
          }
        }
LAB_0035ea7c:
        local_e8 = puVar27;
      } while (iVar12 == 0);
      if (iVar12 - 2U < 2) {
        pcVar45 = source + ((ulong)(uint)inputSize - (long)local_c0);
        pcVar22 = (char *)((long)local_e8 + (long)(pcVar45 + (ulong)(pcVar45 + 0xf0) / 0xff + 1));
        if (pcVar22 <= pcVar26) {
          if (pcVar45 < (char *)0xf) {
            *(char *)local_e8 = (char)pcVar45 << 4;
          }
          else {
            pcVar7 = pcVar45 + -0xf;
            *(char *)local_e8 = -0x10;
            puVar31 = (ulong *)((long)local_e8 + 1);
            if ((char *)0xfe < pcVar7) {
              uVar43 = (ulong)(pcVar45 + -0x10e) / 0xff;
              memset(puVar31,0xff,uVar43 + 1);
              puVar31 = (ulong *)((long)local_e8 + uVar43 + 2);
              pcVar7 = pcVar45 + uVar43 * -0xff + -0x10e;
            }
            *(char *)puVar31 = (char)pcVar7;
            local_e8 = puVar31;
          }
          memcpy((char *)((long)local_e8 + 1),local_c0,(size_t)pcVar45);
          local_e8 = (ulong *)((long)local_e8 + (long)(pcVar45 + 1));
        }
        if (pcVar26 < pcVar22) {
          iVar21 = 0;
        }
        else {
          iVar21 = (int)local_e8 - iVar47;
        }
        goto LAB_0035e21e;
      }
LAB_0035fc1c:
      iVar21 = 0;
      goto LAB_0035e21e;
    }
LAB_0035e21a:
    iVar21 = 0;
  }
LAB_0035e21e:
  (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_stream->internal_donotuse).dictSize = inputSize;
  return iVar21;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* const streamPtr = &LZ4_stream->internal_donotuse;
    const char* dictEnd = streamPtr->dictSize ? (const char*)streamPtr->dictionary + streamPtr->dictSize : NULL;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i, dictSize=%u)", inputSize, streamPtr->dictSize);

    LZ4_renormDictT(streamPtr, inputSize);   /* fix index overflow */
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize < 4)     /* tiny dictionary : not enough for a hash */
      && (dictEnd != source)           /* prefix mode */
      && (inputSize > 0)               /* tolerance : don't lose history, in case next invocation would use prefix mode */
      && (streamPtr->dictCtx == NULL)  /* usingDictCtx */
      ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        /* remove dictionary existence from history, to employ faster prefix mode */
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = source;
    }

    /* Check overlapping input/dictionary space */
    {   const char* const sourceEnd = source + inputSize;
        if ((sourceEnd > (const char*)streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = (const BYTE*)dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                LZ4_memcpy(streamPtr, streamPtr->dictCtx, sizeof(*streamPtr));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {  /* small data <= 4 KB */
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}